

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

void PreProcess(Mat *frame,Net *net,Size *inpSize)

{
  ostream *this;
  Scalar_<double> local_130;
  allocator local_109;
  string local_108 [32];
  _InputArray local_e8;
  Scalar_<double> local_d0;
  _OutputArray local_b0;
  _InputArray local_98;
  Mat local_80 [8];
  Mat blob;
  Size *inpSize_local;
  Net *net_local;
  Mat *frame_local;
  
  if ((inpSize->width < 1) || (inpSize->height < 1)) {
    this = std::operator<<((ostream *)&std::cerr,"Incorrect input dimensions.  Exiting...");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    cv::Mat::Mat(local_80);
    cv::_InputArray::_InputArray(&local_98,frame);
    cv::_OutputArray::_OutputArray(&local_b0,local_80);
    cv::Scalar_<double>::Scalar_(&local_d0);
    cv::dnn::dnn4_v20211004::blobFromImage
              (&local_98,&local_b0,0.00392156862745098,(Size_ *)inpSize,(Scalar_ *)&local_d0,true,
               false,5);
    cv::_OutputArray::~_OutputArray(&local_b0);
    cv::_InputArray::~_InputArray(&local_98);
    cv::_InputArray::_InputArray(&local_e8,local_80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",&local_109);
    cv::Scalar_<double>::Scalar_(&local_130);
    cv::dnn::dnn4_v20211004::Net::setInput
              ((_InputArray *)net,(string *)&local_e8,1.0,(Scalar_ *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    cv::_InputArray::~_InputArray(&local_e8);
    cv::Mat::~Mat(local_80);
  }
  return;
}

Assistant:

void PreProcess(cv::Mat const& frame, cv::dnn::Net& net, cv::Size const& inpSize) noexcept {
  if (inpSize.width <= 0 || inpSize.height <= 0) {
    std::cerr << "Incorrect input dimensions.  Exiting..." << std::endl;
    return;
  }

  //! Create a 4D blob from a frame.
  cv::Mat blob;
  cv::dnn::blobFromImage(frame, blob, 1. / 255., inpSize, cv::Scalar(), true, false);
  
  net.setInput(blob);
  return;
}